

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::protos::gen::IPCFrame::Serialize(IPCFrame *this,Message *msg)

{
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_BindService_*,_false> this_00;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_BindServiceReply_*,_false> this_01;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false> this_02;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_false> this_03;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_RequestError_*,_false> this_04;
  pointer pbVar1;
  uint8_t *src_begin;
  char cVar2;
  Message *pMVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer str;
  ulong uVar4;
  
  uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar4 & 4) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,2,this->request_id_);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 8) != 0) {
    this_00._M_head_impl =
         (this->msg_bind_service_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_BindService,_std::default_delete<perfetto::protos::gen::IPCFrame_BindService>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_BindService_*,_std::default_delete<perfetto::protos::gen::IPCFrame_BindService>_>
         .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_BindService_*,_false>._M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,3);
    IPCFrame_BindService::Serialize(this_00._M_head_impl,pMVar3);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 0x10) != 0) {
    this_01._M_head_impl =
         (this->msg_bind_service_reply_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_BindServiceReply,_std::default_delete<perfetto::protos::gen::IPCFrame_BindServiceReply>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_BindServiceReply_*,_std::default_delete<perfetto::protos::gen::IPCFrame_BindServiceReply>_>
         .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_BindServiceReply_*,_false>.
         _M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,4);
    IPCFrame_BindServiceReply::Serialize(this_01._M_head_impl,pMVar3);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 0x20) != 0) {
    this_02._M_head_impl =
         (this->msg_invoke_method_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
         .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false>._M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,5);
    IPCFrame_InvokeMethod::Serialize(this_02._M_head_impl,pMVar3);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  cVar2 = (char)uVar4;
  if ((uVar4 & 0x40) != 0) {
    this_03._M_head_impl =
         (this->msg_invoke_method_reply_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethodReply,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
         .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_false>.
         _M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,6);
    IPCFrame_InvokeMethodReply::Serialize(this_03._M_head_impl,pMVar3);
    cVar2 = (char)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (cVar2 < '\0') {
    this_04._M_head_impl =
         (this->msg_request_error_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_RequestError,_std::default_delete<perfetto::protos::gen::IPCFrame_RequestError>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_RequestError_*,_std::default_delete<perfetto::protos::gen::IPCFrame_RequestError>_>
         .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_RequestError_*,_false>._M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,7);
    IPCFrame_RequestError::Serialize(this_04._M_head_impl,pMVar3);
  }
  pbVar1 = (this->data_for_testing_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (str = (this->data_for_testing_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; str != pbVar1; str = str + 1) {
    protozero::Message::AppendString(msg,1,str);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void IPCFrame::Serialize(::protozero::Message* msg) const {
  // Field 2: request_id
  if (_has_field_[2]) {
    msg->AppendVarInt(2, request_id_);
  }

  // Field 3: msg_bind_service
  if (_has_field_[3]) {
    (*msg_bind_service_).Serialize(msg->BeginNestedMessage<::protozero::Message>(3));
  }

  // Field 4: msg_bind_service_reply
  if (_has_field_[4]) {
    (*msg_bind_service_reply_).Serialize(msg->BeginNestedMessage<::protozero::Message>(4));
  }

  // Field 5: msg_invoke_method
  if (_has_field_[5]) {
    (*msg_invoke_method_).Serialize(msg->BeginNestedMessage<::protozero::Message>(5));
  }

  // Field 6: msg_invoke_method_reply
  if (_has_field_[6]) {
    (*msg_invoke_method_reply_).Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  // Field 7: msg_request_error
  if (_has_field_[7]) {
    (*msg_request_error_).Serialize(msg->BeginNestedMessage<::protozero::Message>(7));
  }

  // Field 1: data_for_testing
  for (auto& it : data_for_testing_) {
    msg->AppendString(1, it);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}